

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O0

MPP_RET mpp_meta_put(MppMeta meta)

{
  MppMetaService *this;
  MppMetaImpl *impl;
  MppMetaService *service;
  MppMeta meta_local;
  
  if (meta == (MppMeta)0x0) {
    _mpp_log_l(2,"mpp_meta","found NULL input\n","mpp_meta_put");
    meta_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    this = MppMetaService::get_inst();
    MppMetaService::put_meta(this,(MppMetaImpl *)meta);
    meta_local._4_4_ = MPP_OK;
  }
  return meta_local._4_4_;
}

Assistant:

MPP_RET mpp_meta_put(MppMeta meta)
{
    if (NULL == meta) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppMetaService *service = MppMetaService::get_inst();
    MppMetaImpl *impl = (MppMetaImpl *)meta;

    service->put_meta(impl);
    return MPP_OK;
}